

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O3

ON__UINT_PTR * __thiscall ON_SubDHeap::AllocateArray(ON_SubDHeap *this,size_t *capacity)

{
  ulong uVar1;
  size_t *psVar2;
  ON__UINT_PTR *pOVar3;
  size_t sVar4;
  
  uVar1 = *capacity;
  if (uVar1 == 0) {
    return (ON__UINT_PTR *)0x0;
  }
  if (uVar1 < 5) {
    psVar2 = (size_t *)ON_FixedSizePool::AllocateElement(&this->m_fsp5);
    sVar4 = 4;
  }
  else {
    if (uVar1 < 9) {
      psVar2 = (size_t *)ON_FixedSizePool::AllocateElement(&this->m_fsp9);
      sVar4 = 8;
      *psVar2 = 8;
      goto LAB_00613685;
    }
    if (0x10 < uVar1) {
      pOVar3 = AllocateOversizedElement(this,capacity);
      return pOVar3;
    }
    psVar2 = (size_t *)ON_FixedSizePool::AllocateElement(&this->m_fsp17);
    sVar4 = 0x10;
  }
  *psVar2 = sVar4;
LAB_00613685:
  *capacity = sVar4;
  return psVar2 + 1;
}

Assistant:

ON__UINT_PTR* ON_SubDHeap::AllocateArray(size_t* capacity)
{
  ON__UINT_PTR* a;
  size_t requested_capacity = *capacity;
  if (requested_capacity <= 0)
    return nullptr;

  if (requested_capacity <= 4)
  {
    a = (ON__UINT_PTR*)m_fsp5.AllocateElement();
    *a++ = 4;
    *capacity = 4;
    return a;
  }

  if (requested_capacity <= 8)
  {
    a = (ON__UINT_PTR*)m_fsp9.AllocateElement();
    *a++ = 8;
    *capacity = 8;
    return a;
  }

  if (requested_capacity <= 16)
  {
    a = (ON__UINT_PTR*)m_fsp17.AllocateElement();
    *a++ = 16;
    *capacity = 16;
    return a;
  }

  return  AllocateOversizedElement(capacity);
}